

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::FindProgram
                   (char *nameIn,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *userPaths,bool no_system_path)

{
  byte in_CL;
  char *in_RSI;
  string *in_RDI;
  allocator local_51;
  string local_50 [54];
  allocator local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_1a);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,in_RSI,&local_51);
    FindProgram((string *)nameIn,userPaths,no_system_path);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::FindProgram(const char* nameIn,
                                     const std::vector<std::string>& userPaths,
                                     bool no_system_path)
{
  if (!nameIn || !*nameIn) {
    return "";
  }
  return SystemTools::FindProgram(std::string(nameIn), userPaths,
                                  no_system_path);
}